

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall
Json::Path::Path(Path *this,string *path,PathArgument *a1,PathArgument *a2,PathArgument *a3,
                PathArgument *a4,PathArgument *a5)

{
  PathArgument *local_50;
  InArgs in;
  
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::reserve
            (&in,5);
  local_50 = a1;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  emplace_back<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)&in,
             &local_50);
  local_50 = a2;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  emplace_back<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)&in,
             &local_50);
  local_50 = a3;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  emplace_back<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)&in,
             &local_50);
  local_50 = a4;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  emplace_back<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)&in,
             &local_50);
  local_50 = a5;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  emplace_back<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)&in,
             &local_50);
  makePath(this,path,&in);
  std::_Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::
  ~_Vector_base(&in.
                 super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               );
  return;
}

Assistant:

Path::Path(const JSONCPP_STRING& path,
           const PathArgument& a1,
           const PathArgument& a2,
           const PathArgument& a3,
           const PathArgument& a4,
           const PathArgument& a5) {
  InArgs in;
  in.reserve(5);
  in.push_back(&a1);
  in.push_back(&a2);
  in.push_back(&a3);
  in.push_back(&a4);
  in.push_back(&a5);
  makePath(path, in);
}